

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_lib.cpp
# Opt level: O3

void __thiscall ze_lib::context_t::context_t(context_t *this)

{
  byte *pbVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  
  bVar4 = false;
  this->initOnce = 0;
  this->initOnceDrivers = 0;
  (this->initOnceSysMan)._M_once = 0;
  (this->tracingLayerEnableCounter).super___atomic_base<unsigned_int>._M_i = 0;
  (this->zeDdiTable)._M_b._M_p = (__pointer_type)0x0;
  (this->zetDdiTable)._M_b._M_p = (__pointer_type)0x0;
  (this->zesDdiTable)._M_b._M_p = (__pointer_type)0x0;
  (this->zelTracingDdiTable).Tracer.pfnCreate = (zel_pfnTracerCreate_t)0x0;
  (this->zelTracingDdiTable).Tracer.pfnDestroy = (zel_pfnTracerDestroy_t)0x0;
  (this->zelTracingDdiTable).Tracer.pfnSetPrologues = (zel_pfnTracerSetPrologues_t)0x0;
  (this->zelTracingDdiTable).Tracer.pfnSetEpilogues = (zel_pfnTracerSetEpilogues_t)0x0;
  (this->zelTracingDdiTable).Tracer.pfnSetEnabled = (zel_pfnTracerSetEnabled_t)0x0;
  (this->pTracingZeDdiTable)._M_b._M_p = (__pointer_type)0x0;
  this->isInitialized = false;
  this->zesInuse = false;
  this->zeInuse = false;
  this->debugTraceEnabled = false;
  this->tracing_lib = (void *)0x0;
  this->dynamicTracingSupported = true;
  this->loaderDriverGet = (ze_pfnDriverGet_t)0x0;
  pbVar1 = (byte *)getenv("ZE_ENABLE_LOADER_DEBUG_TRACE");
  if (pbVar1 != (byte *)0x0) {
    if (*pbVar1 == 0x30) {
      iVar3 = 1;
      if (pbVar1[1] == 0) {
        bVar4 = false;
        goto LAB_00177535;
      }
    }
    else {
      uVar2 = *pbVar1 - 0x31;
      if (uVar2 == 0) {
        uVar2 = (uint)pbVar1[1];
      }
      iVar3 = -uVar2;
    }
    bVar4 = iVar3 == 0;
  }
LAB_00177535:
  this->debugTraceEnabled = bVar4;
  return;
}

Assistant:

__zedlllocal context_t::context_t()
    {
        debugTraceEnabled = getenv_tobool( "ZE_ENABLE_LOADER_DEBUG_TRACE" );
    }